

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O1

void __thiscall glu::ImmutableTexture2D::upload(ImmutableTexture2D *this)

{
  code *pcVar1;
  int iVar2;
  uint uVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TransferFormat TVar6;
  pointer pPVar7;
  TestError *this_00;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar5;
  
  iVar2 = (*((this->super_Texture2D).m_context)->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  if ((this->super_Texture2D).m_glTexture != 0) {
    (**(code **)(lVar5 + 0xb8))(0xde1);
    pcVar1 = *(code **)(lVar5 + 0xff0);
    uVar3 = tcu::TextureFormat::getPixelSize((TextureFormat *)&(this->super_Texture2D).m_refTexture)
    ;
    uVar8 = 8;
    if ((int)uVar3 < 8) {
      uVar8 = uVar3;
    }
    uVar10 = 1;
    if ((uVar3 & uVar3 - 1) == 0) {
      uVar10 = uVar8;
    }
    (*pcVar1)(0xcf5,uVar10);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    checkError(dVar4,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x12e);
    TVar6 = getTransferFormat((this->super_Texture2D).m_refTexture.super_TextureLevelPyramid.
                              m_format);
    (**(code **)(lVar5 + 0x1380))
              (0xde1,(int)((ulong)((long)(this->super_Texture2D).m_refTexture.
                                         super_TextureLevelPyramid.m_access.
                                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->super_Texture2D).m_refTexture.
                                        super_TextureLevelPyramid.m_access.
                                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x33333333,(this->super_Texture2D).m_format,
               (this->super_Texture2D).m_refTexture.m_width,
               (this->super_Texture2D).m_refTexture.m_height);
    pPVar7 = (this->super_Texture2D).m_refTexture.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->super_Texture2D).m_refTexture.super_TextureLevelPyramid.
                                m_access.
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar7) >> 3) *
            -0x33333333) {
      lVar9 = 8;
      uVar11 = 0;
      lVar12 = 8;
      do {
        if (*(long *)((long)&((this->super_Texture2D).m_refTexture.super_TextureLevelPyramid.m_data.
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar12) != 0) {
          (**(code **)(lVar5 + 0x13b8))
                    (0xde1,uVar11 & 0xffffffff,0,0,
                     *(undefined4 *)
                      ((long)(pPVar7->super_ConstPixelBufferAccess).m_size.m_data + lVar9 + -8),
                     *(undefined4 *)
                      ((long)(pPVar7->super_ConstPixelBufferAccess).m_size.m_data + lVar9 + -4),
                     TVar6,(ulong)TVar6 >> 0x20,
                     *(undefined8 *)
                      ((long)(pPVar7->super_ConstPixelBufferAccess).m_pitch.m_data + lVar9 + 4));
        }
        uVar11 = uVar11 + 1;
        pPVar7 = (this->super_Texture2D).m_refTexture.super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = lVar12 + 0x10;
        lVar9 = lVar9 + 0x28;
      } while ((long)uVar11 <
               (long)((int)((ulong)((long)(this->super_Texture2D).m_refTexture.
                                          super_TextureLevelPyramid.m_access.
                                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar7)
                           >> 3) * -0x33333333));
    }
    dVar4 = (**(code **)(lVar5 + 0x800))();
    checkError(dVar4,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x13d);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_glTexture",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,299);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ImmutableTexture2D::upload (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	DE_ASSERT(!m_isCompressed);

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_2D, m_glTexture);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(m_refTexture.getFormat()));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");

	TransferFormat transferFormat = getTransferFormat(m_refTexture.getFormat());

	gl.texStorage2D(GL_TEXTURE_2D, m_refTexture.getNumLevels(), m_format, m_refTexture.getWidth(), m_refTexture.getHeight());
	for (int levelNdx = 0; levelNdx < m_refTexture.getNumLevels(); levelNdx++)
	{
		if (m_refTexture.isLevelEmpty(levelNdx))
			continue; // Don't upload.

		tcu::ConstPixelBufferAccess access = m_refTexture.getLevel(levelNdx);
		DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*access.getWidth());
		gl.texSubImage2D(GL_TEXTURE_2D, levelNdx, 0, 0, access.getWidth(), access.getHeight(),  transferFormat.format, transferFormat.dataType, access.getDataPtr());
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}